

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-perf.hpp
# Opt level: O0

void perf::stop(void)

{
  ostream *poVar1;
  timer *unaff_retaddr;
  timer *in_stack_00000038;
  ostream *in_stack_00000040;
  
  timer_stack();
  std::stack<perf::timer,_std::deque<perf::timer,_std::allocator<perf::timer>_>_>::top
            ((stack<perf::timer,_std::deque<perf::timer,_std::allocator<perf::timer>_>_> *)0x1034ee)
  ;
  timer::stop(unaff_retaddr);
  inline_out_ptr();
  timer_stack();
  std::stack<perf::timer,_std::deque<perf::timer,_std::allocator<perf::timer>_>_>::top
            ((stack<perf::timer,_std::deque<perf::timer,_std::allocator<perf::timer>_>_> *)0x10350c)
  ;
  poVar1 = operator<<(in_stack_00000040,in_stack_00000038);
  std::operator<<(poVar1,'\n');
  timer_stack();
  std::stack<perf::timer,_std::deque<perf::timer,_std::allocator<perf::timer>_>_>::pop
            ((stack<perf::timer,_std::deque<perf::timer,_std::allocator<perf::timer>_>_> *)0x103532)
  ;
  return;
}

Assistant:

void stop()
    {
        timer_stack().top().stop();
        *inline_out_ptr() << timer_stack().top() << '\n';
        timer_stack().pop();
    }